

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowpassSpeaker.hpp
# Opt level: O2

bool __thiscall
Outputs::Speaker::
LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle,_Konami::SCC,_Yamaha::OPL::OPLL>_>,_false>
::recalculate_filter_if_dirty
          (LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle,_Konami::SCC,_Yamaha::OPL::OPLL>_>,_false>
           *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  FilterParameters local_20;
  
  std::mutex::lock(&this->filter_parameters_mutex_);
  uVar1._0_4_ = (this->filter_parameters_).input_cycles_per_second;
  uVar1._4_4_ = (this->filter_parameters_).output_cycles_per_second;
  uVar2 = *(undefined8 *)((long)&(this->filter_parameters_).output_cycles_per_second + 2);
  local_20.high_frequency_cutoff = (float)((ulong)uVar2 >> 0x10);
  local_20.parameters_are_dirty = SUB81((ulong)uVar2 >> 0x30,0);
  local_20.input_rate_changed = SUB81((ulong)uVar2 >> 0x38,0);
  local_20._0_6_ = SUB86(uVar1,0);
  local_20.output_cycles_per_second._2_2_ = (undefined2)((uint)uVar1._4_4_ >> 0x10);
  (this->filter_parameters_).parameters_are_dirty = false;
  (this->filter_parameters_).input_rate_changed = false;
  pthread_mutex_unlock((pthread_mutex_t *)&this->filter_parameters_mutex_);
  if (local_20.parameters_are_dirty == true) {
    update_filter_coefficients(this,&local_20);
  }
  return local_20.input_rate_changed;
}

Assistant:

bool recalculate_filter_if_dirty() {
			FilterParameters filter_parameters;
			{
				std::lock_guard lock_guard(filter_parameters_mutex_);
				filter_parameters = filter_parameters_;
				filter_parameters_.parameters_are_dirty = false;
				filter_parameters_.input_rate_changed = false;
			}
			if(filter_parameters.parameters_are_dirty) update_filter_coefficients(filter_parameters);
			return filter_parameters.input_rate_changed;
		}